

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher-chachapoly.c
# Opt level: O2

int chachapoly_crypt(chachapoly_ctx *ctx,u_int seqnr,u_char *dest,u_char *src,u_int len,u_int aadlen
                    ,int do_encrypt)

{
  u_char *c;
  int iVar1;
  ulong uVar2;
  u8 local_98 [8];
  ulong local_90;
  u_char *local_88;
  u_char one [8];
  uchar local_78 [24];
  u8 *local_60;
  u8 local_58 [40];
  
  uVar2 = (ulong)len;
  one[0] = '\x01';
  one[1] = '\0';
  one[2] = '\0';
  one[3] = '\0';
  one[4] = '\0';
  one[5] = '\0';
  one[6] = '\0';
  one[7] = '\0';
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  local_58[0x18] = '\0';
  local_58[0x19] = '\0';
  local_58[0x1a] = '\0';
  local_58[0x1b] = '\0';
  local_58[0x1c] = '\0';
  local_58[0x1d] = '\0';
  local_58[0x1e] = '\0';
  local_58[0x1f] = '\0';
  local_88 = dest;
  local_60 = local_98;
  _libssh2_store_u64(&local_60,(ulong)seqnr);
  chacha_ivsetup(&ctx->main_ctx,local_98,(u8 *)0x0);
  chacha_encrypt_bytes(&ctx->main_ctx,local_58,local_58,0x20);
  if (do_encrypt == 0) {
    poly1305_auth(local_78,src,(ulong)(aadlen + len),local_58);
    iVar1 = chachapoly_timingsafe_bcmp(local_78,src + uVar2 + aadlen,0x10);
    if (iVar1 != 0) {
      return -0xc;
    }
  }
  c = local_88;
  local_90 = uVar2;
  if (aadlen != 0) {
    chacha_ivsetup(&ctx->header_ctx,local_98,(u8 *)0x0);
    chacha_encrypt_bytes(&ctx->header_ctx,src,c,aadlen);
  }
  chacha_ivsetup(&ctx->main_ctx,local_98,one);
  chacha_encrypt_bytes(&ctx->main_ctx,src + aadlen,c + aadlen,len);
  if (do_encrypt != 0) {
    poly1305_auth(c + aadlen + local_90,c,(ulong)(aadlen + len),local_58);
  }
  return 0;
}

Assistant:

int
chachapoly_crypt(struct chachapoly_ctx *ctx, u_int seqnr, u_char *dest,
                 const u_char *src, u_int len, u_int aadlen, int do_encrypt)
{
    u_char seqbuf[8];
    const u_char one[8] = { 1, 0, 0, 0, 0, 0, 0, 0 }; /* NB little-endian */
    u_char expected_tag[POLY1305_TAGLEN], poly_key[POLY1305_KEYLEN];
    int r = LIBSSH2_ERROR_INVAL;
    unsigned char *ptr = NULL;

    /*
     * Run ChaCha20 once to generate the Poly1305 key. The IV is the
     * packet sequence number.
     */
    memset(poly_key, 0, sizeof(poly_key));
    ptr = &seqbuf[0];
    _libssh2_store_u64(&ptr, seqnr);
    chacha_ivsetup(&ctx->main_ctx, seqbuf, NULL);
    chacha_encrypt_bytes(&ctx->main_ctx,
                         poly_key, poly_key, sizeof(poly_key));

    /* If decrypting, check tag before anything else */
    if(!do_encrypt) {
        const u_char *tag = src + aadlen + len;

        poly1305_auth(expected_tag, src, aadlen + len, poly_key);
        if(chachapoly_timingsafe_bcmp(expected_tag, tag, POLY1305_TAGLEN)
           != 0) {
            r = LIBSSH2_ERROR_DECRYPT;
            goto out;
        }
    }

    /* Crypt additional data */
    if(aadlen) {
        chacha_ivsetup(&ctx->header_ctx, seqbuf, NULL);
        chacha_encrypt_bytes(&ctx->header_ctx, src, dest, aadlen);
    }

    /* Set Chacha's block counter to 1 */
    chacha_ivsetup(&ctx->main_ctx, seqbuf, one);
    chacha_encrypt_bytes(&ctx->main_ctx, src + aadlen,
                         dest + aadlen, len);

    /* If encrypting, calculate and append tag */
    if(do_encrypt) {
        poly1305_auth(dest + aadlen + len, dest, aadlen + len,
                      poly_key);
    }
    r = 0;
out:
    memset(expected_tag, 0, sizeof(expected_tag));
    memset(seqbuf, 0, sizeof(seqbuf));
    memset(poly_key, 0, sizeof(poly_key));
    return r;
}